

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O2

bool __thiscall draco::CornerTable::Reset(CornerTable *this,int num_faces,int num_vertices)

{
  bool bVar1;
  
  bVar1 = -1 < (num_vertices | num_faces);
  if ((uint)num_faces < 0x55555556 && bVar1) {
    std::
    vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
    ::_M_fill_assign((vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      *)this,(ulong)(uint)(num_faces * 3),(value_type *)&kInvalidVertexIndex);
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::_M_fill_assign(&(this->opposite_corners_).vector_,(ulong)(uint)(num_faces * 3),
                     (value_type *)&kInvalidCornerIndex);
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve(&(this->vertex_corners_).vector_,(ulong)(uint)num_vertices);
    ValenceCache<draco::CornerTable>::ClearValenceCache(&this->valence_cache_);
    ValenceCache<draco::CornerTable>::ClearValenceCacheInaccurate(&this->valence_cache_);
  }
  return (uint)num_faces < 0x55555556 && bVar1;
}

Assistant:

bool CornerTable::Reset(int num_faces, int num_vertices) {
  if (num_faces < 0 || num_vertices < 0) {
    return false;
  }
  const unsigned int num_faces_unsigned = num_faces;
  if (num_faces_unsigned >
      std::numeric_limits<CornerIndex::ValueType>::max() / 3) {
    return false;
  }
  corner_to_vertex_map_.assign(num_faces_unsigned * 3, kInvalidVertexIndex);
  opposite_corners_.assign(num_faces_unsigned * 3, kInvalidCornerIndex);
  vertex_corners_.reserve(num_vertices);
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();
  return true;
}